

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::AddGlobalTarget_EditCache
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  undefined4 extraout_var;
  string *__x;
  bool bVar6;
  cmCustomCommandLine singleLine;
  string edit_cmd;
  GlobalTargetInfo gti;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  value_type local_e8;
  value_type local_c8;
  char *__s;
  
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x1b])();
  __s = (char *)CONCAT44(extraout_var,iVar5);
  if (__s != (char *)0x0) {
    paVar1 = &local_c8.Name.field_2;
    local_c8.Name._M_string_length = 0;
    local_c8.Name.field_2._M_local_buf[0] = '\0';
    paVar3 = &local_c8.Message.field_2;
    local_c8.Message._M_string_length = 0;
    local_c8.Message.field_2._M_local_buf[0] = '\0';
    paVar4 = &local_c8.WorkingDir.field_2;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.WorkingDir._M_string_length = 0;
    local_c8.WorkingDir.field_2._M_local_buf[0] = '\0';
    local_c8.UsesTerminal = false;
    local_c8.Name._M_dataplus._M_p = (pointer)paVar1;
    local_c8.Message._M_dataplus._M_p = (pointer)paVar3;
    local_c8.WorkingDir._M_dataplus._M_p = (pointer)paVar4;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,(ulong)__s);
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*this->_vptr_cmGlobalGenerator[0x1e])(&local_e8,this);
    if (local_e8._M_string_length == 0) {
      __x = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_108,__x);
      paVar2 = &local_128.field_2;
      local_128._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"-E","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                 &local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      local_128._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"echo","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                 &local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      local_128._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"No interactive CMake dialog available.","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                 &local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      bVar6 = false;
      std::__cxx11::string::_M_replace
                ((ulong)&local_c8.Message,0,(char *)local_c8.Message._M_string_length,0x5b2f3c);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_108,&local_e8);
      paVar2 = &local_128.field_2;
      local_128._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"-H$(CMAKE_SOURCE_DIR)","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                 &local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      local_128._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"-B$(CMAKE_BINARY_DIR)","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                 &local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      bVar6 = true;
      std::__cxx11::string::_M_replace
                ((ulong)&local_c8.Message,0,(char *)local_c8.Message._M_string_length,0x5b2eef);
    }
    local_c8.UsesTerminal = bVar6;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&local_c8.CommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (value_type *)&local_108);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.WorkingDir._M_dataplus._M_p != paVar4) {
      operator_delete(local_c8.WorkingDir._M_dataplus._M_p,
                      CONCAT71(local_c8.WorkingDir.field_2._M_allocated_capacity._1_7_,
                               local_c8.WorkingDir.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8.Depends);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              (&local_c8.CommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Message._M_dataplus._M_p != paVar3) {
      operator_delete(local_c8.Message._M_dataplus._M_p,
                      CONCAT71(local_c8.Message.field_2._M_allocated_capacity._1_7_,
                               local_c8.Message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.Name._M_dataplus._M_p,
                      CONCAT71(local_c8.Name.field_2._M_allocated_capacity._1_7_,
                               local_c8.Name.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_EditCache(
  std::vector<GlobalTargetInfo>& targets)
{
  const char* editCacheTargetName = this->GetEditCacheTargetName();
  if (editCacheTargetName) {
    GlobalTargetInfo gti;
    gti.Name = editCacheTargetName;
    cmCustomCommandLine singleLine;

    // Use generator preference for the edit_cache rule if it is defined.
    std::string edit_cmd = this->GetEditCacheCommand();
    if (!edit_cmd.empty()) {
      singleLine.push_back(edit_cmd);
      singleLine.push_back("-H$(CMAKE_SOURCE_DIR)");
      singleLine.push_back("-B$(CMAKE_BINARY_DIR)");
      gti.Message = "Running CMake cache editor...";
      gti.UsesTerminal = true;
      gti.CommandLines.push_back(singleLine);
    } else {
      singleLine.push_back(cmSystemTools::GetCMakeCommand());
      singleLine.push_back("-E");
      singleLine.push_back("echo");
      singleLine.push_back("No interactive CMake dialog available.");
      gti.Message = "No interactive CMake dialog available...";
      gti.UsesTerminal = false;
      gti.CommandLines.push_back(singleLine);
    }

    targets.push_back(gti);
  }
}